

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlDocDumpFormatMemoryEnc(void)

{
  int iVar1;
  int iVar2;
  xmlDocPtr val;
  int *val_00;
  char *val_01;
  int local_54;
  int n_format;
  int format;
  int n_txt_encoding;
  char *txt_encoding;
  int n_doc_txt_len;
  int *doc_txt_len;
  int n_doc_txt_ptr;
  xmlChar **doc_txt_ptr;
  int n_out_doc;
  xmlDocPtr out_doc;
  int mem_base;
  int test_ret;
  
  out_doc._4_4_ = 0;
  for (doc_txt_ptr._4_4_ = 0; (int)doc_txt_ptr._4_4_ < 4; doc_txt_ptr._4_4_ = doc_txt_ptr._4_4_ + 1)
  {
    for (doc_txt_len._4_4_ = 0; (int)doc_txt_len._4_4_ < 1;
        doc_txt_len._4_4_ = doc_txt_len._4_4_ + 1) {
      for (txt_encoding._4_4_ = 0; (int)txt_encoding._4_4_ < 2;
          txt_encoding._4_4_ = txt_encoding._4_4_ + 1) {
        for (n_format = 0; n_format < 4; n_format = n_format + 1) {
          for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
            iVar1 = xmlMemBlocks();
            val = gen_xmlDocPtr(doc_txt_ptr._4_4_,0);
            val_00 = gen_int_ptr(txt_encoding._4_4_,2);
            val_01 = gen_const_char_ptr(n_format,3);
            iVar2 = gen_int(local_54,4);
            xmlDocDumpFormatMemoryEnc(val,0,val_00,val_01,iVar2);
            call_tests = call_tests + 1;
            des_xmlDocPtr(doc_txt_ptr._4_4_,val,0);
            des_int_ptr(txt_encoding._4_4_,val_00,2);
            des_const_char_ptr(n_format,val_01,3);
            des_int(local_54,iVar2,4);
            xmlResetLastError();
            iVar2 = xmlMemBlocks();
            if (iVar1 != iVar2) {
              iVar2 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlDocDumpFormatMemoryEnc",
                     (ulong)(uint)(iVar2 - iVar1));
              out_doc._4_4_ = out_doc._4_4_ + 1;
              printf(" %d",(ulong)doc_txt_ptr._4_4_);
              printf(" %d",(ulong)doc_txt_len._4_4_);
              printf(" %d",(ulong)txt_encoding._4_4_);
              printf(" %d",(ulong)(uint)n_format);
              printf(" %d");
              printf("\n");
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return out_doc._4_4_;
}

Assistant:

static int
test_xmlDocDumpFormatMemoryEnc(void) {
    int test_ret = 0;

#if defined(LIBXML_OUTPUT_ENABLED)
    int mem_base;
    xmlDocPtr out_doc; /* Document to generate XML text from */
    int n_out_doc;
    xmlChar ** doc_txt_ptr; /* Memory pointer for allocated XML text */
    int n_doc_txt_ptr;
    int * doc_txt_len; /* Length of the generated XML text */
    int n_doc_txt_len;
    const char * txt_encoding; /* Character encoding to use when generating XML text */
    int n_txt_encoding;
    int format; /* should formatting spaces been added */
    int n_format;

    for (n_out_doc = 0;n_out_doc < gen_nb_xmlDocPtr;n_out_doc++) {
    for (n_doc_txt_ptr = 0;n_doc_txt_ptr < gen_nb_xmlChar_ptr_ptr;n_doc_txt_ptr++) {
    for (n_doc_txt_len = 0;n_doc_txt_len < gen_nb_int_ptr;n_doc_txt_len++) {
    for (n_txt_encoding = 0;n_txt_encoding < gen_nb_const_char_ptr;n_txt_encoding++) {
    for (n_format = 0;n_format < gen_nb_int;n_format++) {
        mem_base = xmlMemBlocks();
        out_doc = gen_xmlDocPtr(n_out_doc, 0);
        doc_txt_ptr = gen_xmlChar_ptr_ptr(n_doc_txt_ptr, 1);
        doc_txt_len = gen_int_ptr(n_doc_txt_len, 2);
        txt_encoding = gen_const_char_ptr(n_txt_encoding, 3);
        format = gen_int(n_format, 4);

        xmlDocDumpFormatMemoryEnc(out_doc, doc_txt_ptr, doc_txt_len, txt_encoding, format);
        call_tests++;
        des_xmlDocPtr(n_out_doc, out_doc, 0);
        des_xmlChar_ptr_ptr(n_doc_txt_ptr, doc_txt_ptr, 1);
        des_int_ptr(n_doc_txt_len, doc_txt_len, 2);
        des_const_char_ptr(n_txt_encoding, txt_encoding, 3);
        des_int(n_format, format, 4);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlDocDumpFormatMemoryEnc",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_out_doc);
            printf(" %d", n_doc_txt_ptr);
            printf(" %d", n_doc_txt_len);
            printf(" %d", n_txt_encoding);
            printf(" %d", n_format);
            printf("\n");
        }
    }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}